

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloopback.c
# Opt level: O0

char * ChannelsName(ALCenum chans)

{
  ALCenum chans_local;
  char *local_8;
  
  switch(chans) {
  case 0x1500:
    local_8 = "Mono";
    break;
  case 0x1501:
    local_8 = "Stereo";
    break;
  default:
    local_8 = "Unknown Channels";
    break;
  case 0x1503:
    local_8 = "Quadraphonic";
    break;
  case 0x1504:
    local_8 = "5.1 Surround";
    break;
  case 0x1505:
    local_8 = "6.1 Surround";
    break;
  case 0x1506:
    local_8 = "7.1 Surround";
  }
  return local_8;
}

Assistant:

static const char *ChannelsName(ALCenum chans)
{
    switch(chans)
    {
    case ALC_MONO_SOFT: return "Mono";
    case ALC_STEREO_SOFT: return "Stereo";
    case ALC_QUAD_SOFT: return "Quadraphonic";
    case ALC_5POINT1_SOFT: return "5.1 Surround";
    case ALC_6POINT1_SOFT: return "6.1 Surround";
    case ALC_7POINT1_SOFT: return "7.1 Surround";
    }
    return "Unknown Channels";
}